

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::oneWayComparePointSets
               (TestLog *log,Surface *errorDst,TessPrimitiveType primitiveType,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *subset,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *superset,
               char *subsetName,char *supersetName,RGBA *errorColor)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  const_reference this;
  MessageBuilder *pMVar4;
  float fVar5;
  float fVar6;
  bool local_3be;
  MessageBuilder local_3a8;
  MessageBuilder local_228;
  Vector<bool,_3> local_a6;
  Vector<bool,_3> local_a3;
  const_reference local_a0;
  Vec3 *superPt;
  int superNdx;
  int firstCandidateNdx;
  Vec3 matchMax;
  undefined1 local_78 [8];
  Vec3 matchMin;
  bool matchFound;
  Vec3 *subPt;
  int subNdx;
  int numFailuresDetected;
  int maxNumFailurePrints;
  float epsilon;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> supersetSorted;
  char *subsetName_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *superset_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *subset_local;
  TessPrimitiveType primitiveType_local;
  Surface *errorDst_local;
  TestLog *log_local;
  
  supersetSorted.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)subsetName;
  sorted<tcu::Vector<float,3>,bool(*)(tcu::Vector<float,3>const&,tcu::Vector<float,3>const&)>
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &maxNumFailurePrints,(tessellation *)superset,
             (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)vec3XLessThan
             ,(_func_bool_Vector<float,_3>_ptr_Vector<float,_3>_ptr *)subset);
  subPt._4_4_ = 0;
  subPt._0_4_ = 0;
  do {
    sVar3 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      (subset);
    if ((int)sVar3 <= (int)subPt) {
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                 &maxNumFailurePrints);
      return subPt._4_4_ == 0;
    }
    register0x00000000 =
         std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                   (subset,(long)(int)subPt);
    matchMin.m_data[1]._3_1_ = 0;
    tcu::operator-((tcu *)local_78,register0x00000000,0.01);
    tcu::operator+((tcu *)&superNdx,stack0xffffffffffffff98,0.01);
    fVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_78);
    superPt._4_4_ =
         binarySearchFirstVec3WithXAtLeast
                   ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    &maxNumFailurePrints,fVar5);
    iVar1 = superPt._4_4_;
    if (-1 < superPt._4_4_) {
      while( true ) {
        superPt._0_4_ = iVar1;
        iVar1 = (int)superPt;
        sVar3 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                          ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )&maxNumFailurePrints);
        bVar2 = false;
        if (iVar1 < (int)sVar3) {
          this = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                 operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)&maxNumFailurePrints,(long)(int)superPt);
          fVar5 = tcu::Vector<float,_3>::x(this);
          fVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)&superNdx);
          bVar2 = fVar5 <= fVar6;
        }
        if (!bVar2) goto LAB_00d9db62;
        local_a0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                   operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)&maxNumFailurePrints,(long)(int)superPt);
        tcu::greaterThanEqual<float,3>((tcu *)&local_a3,local_a0,(Vector<float,_3> *)local_78);
        bVar2 = tcu::boolAll<3>(&local_a3);
        local_3be = false;
        if (bVar2) {
          tcu::lessThanEqual<float,3>((tcu *)&local_a6,local_a0,(Vector<float,_3> *)&superNdx);
          local_3be = tcu::boolAll<3>(&local_a6);
        }
        if (local_3be != false) break;
        iVar1 = (int)superPt + 1;
      }
      matchMin.m_data[1]._3_1_ = 1;
    }
LAB_00d9db62:
    if ((matchMin.m_data[1]._3_1_ & 1) == 0) {
      subPt._4_4_ = subPt._4_4_ + 1;
      if (subPt._4_4_ < 5) {
        tcu::TestLog::operator<<(&local_228,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [22])"Failure: no matching ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&supersetName);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [18])" point found for ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char **)&supersetSorted.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])" point ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,stack0xffffffffffffff98);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_228);
      }
      else if (subPt._4_4_ == 5) {
        tcu::TestLog::operator<<(&local_3a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_3a8,(char (*) [25])"Note: More errors follow");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3a8);
      }
      drawTessCoordPoint(errorDst,primitiveType,stack0xffffffffffffff98,errorColor,4);
    }
    subPt._0_4_ = (int)subPt + 1;
  } while( true );
}

Assistant:

bool oneWayComparePointSets (tcu::TestLog&					log,
							 tcu::Surface&					errorDst,
							 const TessPrimitiveType		primitiveType,
							 const std::vector<tcu::Vec3>&	subset,
							 const std::vector<tcu::Vec3>&	superset,
							 const char*					subsetName,
							 const char*					supersetName,
							 const tcu::RGBA&				errorColor)
{
	const std::vector<tcu::Vec3> supersetSorted		 = sorted(superset, vec3XLessThan);
	const float					 epsilon			 = 0.01f;
	const int					 maxNumFailurePrints = 5;
	int							 numFailuresDetected = 0;

	for (int subNdx = 0; subNdx < static_cast<int>(subset.size()); ++subNdx)
	{
		const tcu::Vec3& subPt = subset[subNdx];

		bool matchFound = false;

		{
			// Binary search the index of the first point in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
			const tcu::Vec3	matchMin			= subPt - epsilon;
			const tcu::Vec3	matchMax			= subPt + epsilon;
			const int		firstCandidateNdx	= binarySearchFirstVec3WithXAtLeast(supersetSorted, matchMin.x());

			if (firstCandidateNdx >= 0)
			{
				// Compare subPt to all points in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
				for (int superNdx = firstCandidateNdx; superNdx < static_cast<int>(supersetSorted.size()) && supersetSorted[superNdx].x() <= matchMax.x(); ++superNdx)
				{
					const tcu::Vec3& superPt = supersetSorted[superNdx];

					if (tcu::boolAll(tcu::greaterThanEqual	(superPt, matchMin)) &&
						tcu::boolAll(tcu::lessThanEqual		(superPt, matchMax)))
					{
						matchFound = true;
						break;
					}
				}
			}
		}

		if (!matchFound)
		{
			++numFailuresDetected;
			if (numFailuresDetected < maxNumFailurePrints)
				log << tcu::TestLog::Message << "Failure: no matching " << supersetName << " point found for " << subsetName << " point " << subPt << tcu::TestLog::EndMessage;
			else if (numFailuresDetected == maxNumFailurePrints)
				log << tcu::TestLog::Message << "Note: More errors follow" << tcu::TestLog::EndMessage;

			drawTessCoordPoint(errorDst, primitiveType, subPt, errorColor, 4);
		}
	}

	return numFailuresDetected == 0;
}